

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfScanLineInputFile.cpp
# Opt level: O3

void Imf_2_5::anon_unknown_7::readPixelData
               (InputStreamMutex *streamData,Data *ifd,int minY,char **buffer,int *dataSize)

{
  pointer puVar1;
  unsigned_long uVar2;
  IStream *pIVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  InputExc *pIVar5;
  ostream *poVar6;
  ArgExc *this;
  char *text;
  ulong uVar7;
  stringstream _iex_throw_s;
  int local_1b8 [4];
  ostream local_1a8 [376];
  
  uVar7 = (long)(minY - ifd->minY) / (long)ifd->linesInBuffer;
  iVar4 = (int)uVar7;
  if ((iVar4 < 0) ||
     (puVar1 = (ifd->lineOffsets).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start,
     (int)((ulong)((long)(ifd->lineOffsets).
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)puVar1) >> 3) <= iVar4)) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Invalid scan line ",0x12);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,minY);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," requested or missing.",0x16);
    pIVar5 = (InputExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::InputExc::InputExc(pIVar5,(stringstream *)local_1b8);
    __cxa_throw(pIVar5,&Iex_2_5::InputExc::typeinfo,Iex_2_5::TypeExc::~TypeExc);
  }
  uVar7 = uVar7 & 0xffffffff;
  uVar2 = puVar1[uVar7];
  if (uVar2 == 0) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Scan line ",10);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,minY);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," is missing.",0xc);
    pIVar5 = (InputExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::InputExc::InputExc(pIVar5,(stringstream *)local_1b8);
    __cxa_throw(pIVar5,&Iex_2_5::InputExc::typeinfo,Iex_2_5::TypeExc::~TypeExc);
  }
  if ((ifd->version & 0x1000) == 0) {
    if (ifd->nextLineBufferMinY == minY) goto LAB_005be5cd;
  }
  else {
    iVar4 = (*streamData->is->_vptr_IStream[5])();
    if (CONCAT44(extraout_var,iVar4) ==
        (ifd->lineOffsets).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
        .super__Vector_impl_data._M_start[uVar7]) goto LAB_005be5cd;
  }
  (*streamData->is->_vptr_IStream[6])(streamData->is,uVar2);
LAB_005be5cd:
  if (((ifd->version & 0x1000) != 0) &&
     ((*streamData->is->_vptr_IStream[3])(streamData->is,local_1b8,4),
     local_1b8[0] != ifd->partNumber)) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Unexpected part number ",0x17);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,local_1b8[0]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", should be ",0xc);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,ifd->partNumber);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,".",1);
    this = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc(this,(stringstream *)local_1b8);
    __cxa_throw(this,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::TypeExc::~TypeExc);
  }
  (*streamData->is->_vptr_IStream[3])(streamData->is,local_1b8,4);
  iVar4 = local_1b8[0];
  (*streamData->is->_vptr_IStream[3])(streamData->is,local_1b8,4);
  *dataSize = local_1b8[0];
  if (iVar4 == minY) {
    if ((-1 < local_1b8[0]) && (local_1b8[0] <= (int)ifd->lineBufferSize)) {
      iVar4 = (*streamData->is->_vptr_IStream[2])();
      pIVar3 = streamData->is;
      if ((char)iVar4 == '\0') {
        (*pIVar3->_vptr_IStream[3])(pIVar3,*buffer,(ulong)(uint)*dataSize);
      }
      else {
        iVar4 = (*pIVar3->_vptr_IStream[4])(pIVar3,(ulong)(uint)*dataSize);
        *buffer = (char *)CONCAT44(extraout_var_00,iVar4);
      }
      iVar4 = -ifd->linesInBuffer;
      if (ifd->lineOrder == INCREASING_Y) {
        iVar4 = ifd->linesInBuffer;
      }
      ifd->nextLineBufferMinY = iVar4 + minY;
      return;
    }
    pIVar5 = (InputExc *)__cxa_allocate_exception(0x48);
    text = "Unexpected data block length.";
  }
  else {
    pIVar5 = (InputExc *)__cxa_allocate_exception(0x48);
    text = "Unexpected data block y coordinate.";
  }
  Iex_2_5::InputExc::InputExc(pIVar5,text);
  __cxa_throw(pIVar5,&Iex_2_5::InputExc::typeinfo,Iex_2_5::TypeExc::~TypeExc);
}

Assistant:

void
readPixelData (InputStreamMutex *streamData,
               ScanLineInputFile::Data *ifd,
	       int minY,
	       char *&buffer,
	       int &dataSize)
{
    //
    // Read a single line buffer from the input file.
    //
    // If the input file is not memory-mapped, we copy the pixel data into
    // into the array pointed to by buffer.  If the file is memory-mapped,
    // then we change where buffer points to instead of writing into the
    // array (hence buffer needs to be a reference to a char *).
    //

    int lineBufferNumber = (minY - ifd->minY) / ifd->linesInBuffer;
    if (lineBufferNumber < 0 || lineBufferNumber >= int(ifd->lineOffsets.size()))
        THROW (IEX_NAMESPACE::InputExc, "Invalid scan line " << minY << " requested or missing.");

    Int64 lineOffset = ifd->lineOffsets[lineBufferNumber];

    if (lineOffset == 0)
	THROW (IEX_NAMESPACE::InputExc, "Scan line " << minY << " is missing.");

    //
    // Seek to the start of the scan line in the file,
    // if necessary.
    //

    if ( !isMultiPart(ifd->version) )
    {
        if (ifd->nextLineBufferMinY != minY)
            streamData->is->seekg (lineOffset);
    }
    else
    {
        //
        // In a multi-part file, the file pointer may have been moved by
        // other parts, so we have to ask tellg() where we are.
        //
        if (streamData->is->tellg() != ifd->lineOffsets[lineBufferNumber])
            streamData->is->seekg (lineOffset);
    }

    //
    // Read the data block's header.
    //

    int yInFile;

    //
    // Read the part number when we are dealing with a multi-part file.
    //
    if (isMultiPart(ifd->version))
    {
        int partNumber;
        OPENEXR_IMF_INTERNAL_NAMESPACE::Xdr::read <OPENEXR_IMF_INTERNAL_NAMESPACE::StreamIO> (*streamData->is, partNumber);
        if (partNumber != ifd->partNumber)
        {
            THROW (IEX_NAMESPACE::ArgExc, "Unexpected part number " << partNumber
                   << ", should be " << ifd->partNumber << ".");
        }
    }

    OPENEXR_IMF_INTERNAL_NAMESPACE::Xdr::read <OPENEXR_IMF_INTERNAL_NAMESPACE::StreamIO> (*streamData->is, yInFile);
    OPENEXR_IMF_INTERNAL_NAMESPACE::Xdr::read <OPENEXR_IMF_INTERNAL_NAMESPACE::StreamIO> (*streamData->is, dataSize);
    
    if (yInFile != minY)
        throw IEX_NAMESPACE::InputExc ("Unexpected data block y coordinate.");

    if (dataSize < 0 || dataSize > static_cast<int>(ifd->lineBufferSize) )
        throw IEX_NAMESPACE::InputExc ("Unexpected data block length.");

    //
    // Read the pixel data.
    //

    if (streamData->is->isMemoryMapped ())
        buffer = streamData->is->readMemoryMapped (dataSize);
    else
        streamData->is->read (buffer, dataSize);

    //
    // Keep track of which scan line is the next one in
    // the file, so that we can avoid redundant seekg()
    // operations (seekg() can be fairly expensive).
    //

    if (ifd->lineOrder == INCREASING_Y)
        ifd->nextLineBufferMinY = minY + ifd->linesInBuffer;
    else
        ifd->nextLineBufferMinY = minY - ifd->linesInBuffer;
}